

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.h
# Opt level: O2

StringVector * __thiscall
CoreML::Specification::GLMClassifier::mutable_stringclasslabels(GLMClassifier *this)

{
  StringVector *this_00;
  
  if (this->_oneof_case_[0] == 100) {
    this_00 = (this->ClassLabels_).stringclasslabels_;
  }
  else {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 100;
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    (this->ClassLabels_).stringclasslabels_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::StringVector* GLMClassifier::mutable_stringclasslabels() {
  if (!has_stringclasslabels()) {
    clear_ClassLabels();
    set_has_stringclasslabels();
    ClassLabels_.stringclasslabels_ = new ::CoreML::Specification::StringVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.GLMClassifier.stringClassLabels)
  return ClassLabels_.stringclasslabels_;
}